

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

void pass2_no_dither(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize)

{
  int iVar1;
  int iVar2;
  hist3d ppahVar3;
  int c0_00;
  int c1_00;
  int c2_00;
  histcell *phVar4;
  int b;
  int g;
  int r;
  histptr cachep;
  int local_50;
  int col;
  int row;
  int c2;
  int c1;
  int c0;
  hist3d histogram;
  int num_rows;
  int width;
  uchar *outptr;
  int *inptr;
  my_cquantize_ptr cquantize_local;
  gdImagePtr nim_local;
  gdImagePtr oim_local;
  
  iVar1 = oim->sx;
  iVar2 = oim->sy;
  ppahVar3 = cquantize->histogram;
  for (local_50 = 0; local_50 < iVar2; local_50 = local_50 + 1) {
    outptr = (uchar *)oim->tpixels[local_50];
    _num_rows = nim->pixels[local_50];
    for (cachep._4_4_ = iVar1; 0 < cachep._4_4_; cachep._4_4_ = cachep._4_4_ + -1) {
      if ((oim->transparent < 0) || (oim->transparent != *(int *)outptr)) {
        c0_00 = (int)(*(uint *)outptr & 0xff0000) >> 0x13;
        c1_00 = (int)(*(uint *)outptr & 0xff00) >> 10;
        c2_00 = (int)(*(uint *)outptr & 0xff) >> 3;
        phVar4 = ppahVar3[c0_00][c1_00] + c2_00;
        if (*phVar4 == 0) {
          fill_inverse_cmap(oim,nim,cquantize,c0_00,c1_00,c2_00);
        }
        *_num_rows = (char)*phVar4 + 0xff;
      }
      else {
        *_num_rows = (uchar)nim->colorsTotal;
      }
      outptr = outptr + 4;
      _num_rows = _num_rows + 1;
    }
  }
  return;
}

Assistant:

METHODDEF (void)
pass2_no_dither (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize)
{
	register int *inptr;
	register unsigned char *outptr;
	int width = oim->sx;
	int num_rows = oim->sy;
	hist3d histogram = cquantize->histogram;
	register int c0, c1, c2;
	int row;
	JDIMENSION col;
	register histptr cachep;


	for (row = 0; row < num_rows; row++) {
		inptr = input_buf[row];
		outptr = output_buf[row];
		for (col = width; col > 0; col--) {
			/* get pixel value and index into the cache */
			int r, g, b;
			r = gdTrueColorGetRed (*inptr);
			g = gdTrueColorGetGreen (*inptr);
			/*
			   2.0.24: inptr must not be incremented until after
			   transparency check, if any. Thanks to "Super Pikeman."
			 */
			b = gdTrueColorGetBlue (*inptr);

			/* If the pixel is transparent, we assign it the palette index that
			 * will later be added at the end of the palette as the transparent
			 * index. */
			if ((oim->transparent >= 0) && (oim->transparent == *inptr)) {
				*outptr++ = nim->colorsTotal;
				inptr++;
				continue;
			}
			inptr++;
			c0 = r >> C0_SHIFT;
			c1 = g >> C1_SHIFT;
			c2 = b >> C2_SHIFT;
			cachep = &histogram[c0][c1][c2];
			/* If we have not seen this color before, find nearest colormap entry */
			/* and update the cache */
			if (*cachep == 0)
				fill_inverse_cmap (oim, nim, cquantize, c0, c1, c2);
			/* Now emit the colormap index for this cell */
			*outptr++ = (*cachep - 1);
		}
	}
}